

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_uc_to_curlcode(CURLUcode uc)

{
  CURLcode CVar1;
  
  CVar1 = CURLE_URL_MALFORMAT;
  if (uc - CURLUE_UNSUPPORTED_SCHEME < 4) {
    CVar1 = *(CURLcode *)(&DAT_00184948 + (ulong)(uc - CURLUE_UNSUPPORTED_SCHEME) * 4);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_uc_to_curlcode(CURLUcode uc)
{
  switch(uc) {
  default:
    return CURLE_URL_MALFORMAT;
  case CURLUE_UNSUPPORTED_SCHEME:
    return CURLE_UNSUPPORTED_PROTOCOL;
  case CURLUE_OUT_OF_MEMORY:
    return CURLE_OUT_OF_MEMORY;
  case CURLUE_USER_NOT_ALLOWED:
    return CURLE_LOGIN_DENIED;
  }
}